

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitYieldAndResume(RegSlot resumeValueReg,RegSlot inputReg,ByteCodeLabel resumeNormalLabel,
                       ByteCodeLabel resumeThrowLabel,ByteCodeGenerator *byteCodeGenerator,
                       FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot RVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot resultReg;
  uint *puVar4;
  undefined4 *puVar5;
  ByteCodeLabel labelID;
  uint local_48 [2];
  undefined4 *local_40;
  ByteCodeLabel local_38;
  ByteCodeLabel local_34;
  
  this = &byteCodeGenerator->m_writer;
  local_38 = resumeNormalLabel;
  local_34 = resumeThrowLabel;
  Js::ByteCodeWriter::SetCurrentLoopHasYield(this);
  if (funcInfo->yieldRegister != inputReg) {
    Js::ByteCodeWriter::Reg2(this,Ld_A,funcInfo->yieldRegister,inputReg);
  }
  ByteCodeGenerator::EmitLeaveOpCodesBeforeYield(byteCodeGenerator);
  Js::ByteCodeWriter::Reg2(this,Yield,funcInfo->yieldRegister,funcInfo->yieldRegister);
  ByteCodeGenerator::EmitTryBlockHeadersAfterYield(byteCodeGenerator);
  resultReg = FuncInfo::AcquireTmpRegister(funcInfo);
  EmitGetObjectProperty(resultReg,funcInfo->yieldRegister,0xe7,byteCodeGenerator,funcInfo);
  EmitGetObjectProperty(resumeValueReg,funcInfo->yieldRegister,0x197,byteCodeGenerator,funcInfo);
  local_48[0] = 0;
  puVar4 = JsUtil::
           BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::LookupWithKey<unsigned_int>
                     (&funcInfo->constantToRegister,local_48,&Js::Constants::NoRegister);
  RVar1 = *puVar4;
  if (RVar1 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_40 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2911,"(normalConst != Js::Constants::NoRegister)",
                       "normalConst != Js::Constants::NoRegister");
    if (!bVar3) goto LAB_0076f566;
    *local_40 = 0;
  }
  Js::ByteCodeWriter::BrReg2(this,BrSrEq_A,local_38,resultReg,RVar1);
  labelID = local_34;
  if (local_34 != -1) {
    local_48[1] = 1;
    puVar4 = JsUtil::
             BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::LookupWithKey<unsigned_int>
                       (&funcInfo->constantToRegister,local_48 + 1,&Js::Constants::NoRegister);
    RVar1 = *puVar4;
    if (RVar1 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x291c,"(throwConst != Js::Constants::NoRegister)",
                         "throwConst != Js::Constants::NoRegister");
      if (!bVar3) {
LAB_0076f566:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      labelID = local_34;
    }
    Js::ByteCodeWriter::BrReg2(this,BrSrEq_A,labelID,resultReg,RVar1);
  }
  FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
  return;
}

Assistant:

void EmitYieldAndResume(
    Js::RegSlot resumeValueReg,
    Js::RegSlot inputReg,
    Js::ByteCodeLabel resumeNormalLabel,
    Js::ByteCodeLabel resumeThrowLabel,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    // If `resultThrowLabel` is a valid label, then the instruction
    // sequence following this call must handle the return yield resume
    // case. Otherwise, the instruction sequence following this call
    // must handle both the throw and return cases.

    auto* writer = byteCodeGenerator->Writer();

    // If in a loop mark it as containing Yield and hence not eligible for Jit loop body
    writer->SetCurrentLoopHasYield();

    if (inputReg != funcInfo->yieldRegister)
        writer->Reg2(Js::OpCode::Ld_A, funcInfo->yieldRegister, inputReg);

    // Yield the result. On resume, the resume yield object will be in yieldRegister
    byteCodeGenerator->EmitLeaveOpCodesBeforeYield();
    writer->Reg2(Js::OpCode::Yield, funcInfo->yieldRegister, funcInfo->yieldRegister);
    byteCodeGenerator->EmitTryBlockHeadersAfterYield();

    Js::RegSlot resumeKindReg = funcInfo->AcquireTmpRegister();

    // Get the "kind" property of the resume object
    EmitGetObjectProperty(
        resumeKindReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::kind,
        byteCodeGenerator,
        funcInfo);

    // Get the "value" property of the resume object
    EmitGetObjectProperty(
        resumeValueReg,
        funcInfo->yieldRegister,
        Js::PropertyIds::value,
        byteCodeGenerator,
        funcInfo);

    Js::RegSlot normalConst = funcInfo->constantToRegister.Lookup(
        (uint)Js::ResumeYieldKind::Normal,
        Js::Constants::NoRegister);

    Assert(normalConst != Js::Constants::NoRegister);

    // Branch to normal resume if kind is Normal
    writer->BrReg2(Js::OpCode::BrSrEq_A, resumeNormalLabel, resumeKindReg, normalConst);

    if (resumeThrowLabel != Js::Constants::NoByteCodeLabel)
    {
        Js::RegSlot throwConst = funcInfo->constantToRegister.Lookup(
            (uint)Js::ResumeYieldKind::Throw,
            Js::Constants::NoRegister);

        Assert(throwConst != Js::Constants::NoRegister);

        // Branch to throw if kind is Throw
        writer->BrReg2(Js::OpCode::BrSrEq_A, resumeThrowLabel, resumeKindReg, throwConst);
    }

    funcInfo->ReleaseTmpRegister(resumeKindReg);
}